

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processDisconnect(CommonCore *this,bool skipUnregister)

{
  byte bVar1;
  bool bVar2;
  BrokerState BVar3;
  byte in_SIL;
  CommonCore *in_RDI;
  ActionMessage dis_1;
  ActionMessage dis;
  BrokerState cBrokerState;
  ActionMessage *in_stack_fffffffffffffd78;
  ActionMessage *in_stack_fffffffffffffd80;
  BrokerBase *this_00;
  BrokerBase *in_stack_fffffffffffffd88;
  ActionMessage *in_stack_fffffffffffffda0;
  SmallBuffer *in_stack_fffffffffffffda8;
  CommonCore *in_stack_fffffffffffffdf0;
  undefined1 local_1a0 [204];
  undefined4 local_d4;
  BaseType local_d0;
  GlobalFederateId local_cc;
  undefined1 local_c8 [8];
  BaseType local_c0;
  action_t in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff6;
  
  bVar1 = in_SIL & 1;
  BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x530b91);
  if (CONFIGURED < BVar3) {
    if (BVar3 < TERMINATING) {
      BrokerBase::setBrokerState
                (in_stack_fffffffffffffd88,(BrokerState)((ulong)in_stack_fffffffffffffd80 >> 0x30));
      sendDisconnect((CommonCore *)
                     CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffff6,
                                             CONCAT24(BVar3,in_stack_fffffffffffffff0))),
                     in_stack_ffffffffffffffec);
      bVar2 = GlobalBrokerId::operator!=
                        (&(in_RDI->super_BrokerBase).global_broker_id_local,(GlobalBrokerId)0x0);
      if ((bVar2) &&
         (bVar2 = GlobalBrokerId::isValid(&(in_RDI->super_BrokerBase).global_broker_id_local), bVar2
         )) {
        ActionMessage::ActionMessage(in_stack_fffffffffffffda0,(action_t)((ulong)in_RDI >> 0x20));
        local_d0 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
        GlobalFederateId::GlobalFederateId(&local_cc,(GlobalBrokerId)local_d0);
        local_c0 = local_cc.gid;
        local_d4 = 0;
        (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,0,local_c8);
        ActionMessage::~ActionMessage(in_stack_fffffffffffffd80);
      }
      else {
        ActionMessage::ActionMessage(in_stack_fffffffffffffda0,(action_t)((ulong)in_RDI >> 0x20));
        getIdentifier_abi_cxx11_(in_RDI);
        SmallBuffer::operator=
                  (in_stack_fffffffffffffda8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffda0);
        (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,0,local_1a0);
        ActionMessage::~ActionMessage(in_stack_fffffffffffffd80);
      }
      this_00 = &in_RDI->super_BrokerBase;
      ActionMessage::ActionMessage(in_stack_fffffffffffffda0,(action_t)((ulong)in_RDI >> 0x20));
      BrokerBase::addActionMessage(this_00,in_stack_fffffffffffffd78);
      ActionMessage::~ActionMessage((ActionMessage *)this_00);
      return;
    }
    (*(in_RDI->super_Core)._vptr_Core[0x68])();
  }
  BrokerBase::setBrokerState
            (in_stack_fffffffffffffd88,(BrokerState)((ulong)in_stack_fffffffffffffd80 >> 0x30));
  if ((bVar1 & 1) == 0) {
    unregister(in_stack_fffffffffffffdf0);
  }
  gmlc::concurrency::TriggerVariable::trigger((TriggerVariable *)in_stack_fffffffffffffd88);
  return;
}

Assistant:

void CommonCore::processDisconnect(bool skipUnregister)
{
    auto cBrokerState = getBrokerState();
    if (cBrokerState > BrokerState::CONFIGURED) {
        if (cBrokerState < BrokerState::TERMINATING) {
            setBrokerState(BrokerState::TERMINATING);
            sendDisconnect();
            if ((global_broker_id_local != parent_broker_id) &&
                (global_broker_id_local.isValid())) {
                ActionMessage dis(CMD_DISCONNECT);
                dis.source_id = global_broker_id_local;
                transmit(parent_route_id, dis);
            } else {
                ActionMessage dis(CMD_DISCONNECT_NAME);
                dis.payload = getIdentifier();
                transmit(parent_route_id, dis);
            }
            addActionMessage(CMD_STOP);
            return;
        }
        brokerDisconnect();
    }
    setBrokerState(BrokerState::TERMINATED);
    if (!skipUnregister) {
        unregister();
    }
    disconnection.trigger();
}